

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BitsToFloatCaseInstance::~BitsToFloatCaseInstance
          (BitsToFloatCaseInstance *this)

{
  CommonFunctionTestInstance::~CommonFunctionTestInstance(&this->super_CommonFunctionTestInstance);
  operator_delete(this,0x220);
  return;
}

Assistant:

BitsToFloatCaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
		: CommonFunctionTestInstance	(context, shaderType, spec, numValues, name)
	{
	}